

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall merlin::graph::clear(graph *this)

{
  bool bVar1;
  graph *this_local;
  
  clear_edges(this);
  while( true ) {
    bVar1 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            empty(&this->m_vvacant);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              (&this->m_vvacant);
  }
  std::vector<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>::
  resize(&this->m_adj,0);
  return;
}

Assistant:

void clear() {
		clear_edges();
		while (!m_vvacant.empty()) m_vvacant.pop();
		m_adj.resize(0);
	}